

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

float ffvers(float *version)

{
  *version = 4.0601997;
  return 4.0601997;
}

Assistant:

float ffvers(float *version)  /* IO - version number */
/*
  return the current version number of the FITSIO software
  
  Note that this method of calculation limits minor/micro fields to < 100.
*/
{
      *version = (float)CFITSIO_MAJOR + (float)(.01*CFITSIO_MINOR)
                   + (float)(.0001*CFITSIO_MICRO);

/*    *version = 4.6.2      Mar 2025 (autotools change only)

   Previous releases:
      *version = 4.6.1      Mar 2025 (autotools/cmake config changes only)
      *version = 4.6.0      Mar 2025
      *version = 4.5.0      Aug 2024
      *version = 4.4.1      Jun 2024 (license change)
      *version = 4.4.0      Feb 2024
      *version = 4.3.1      Nov 2023 (patch)
      *version = 4.3.0      Jul 2023
      *version = 4.2.0      Nov 2022
      *version = 4.1.0      Feb 2022
      *version = 4.0.0      May 2021
      *version = 3.49       Aug 2020
      *version = 3.48       Apr 2020
      *version = 3.47       May 2019
      *version = 3.46       Oct 2018
      *version = 3.45       May 2018
      *version = 3.44       Apr 2018
      *version = 3.43       Mar 2018
      *version = 3.42       Mar 2017
      *version = 3.41       Nov 2016
      *version = 3.40       Oct 2016
      *version = 3.39       Apr 2016
      *version = 3.38       Feb 2016
      *version = 3.37     3 Jun 2014
      *version = 3.36     6 Dec 2013
      *version = 3.35    23 May 2013
      *version = 3.34    20 Mar 2013
      *version = 3.33    14 Feb 2013
      *version = 3.32       Oct 2012
      *version = 3.31    18 Jul 2012
      *version = 3.30    11 Apr 2012
      *version = 3.29    22 Sep 2011
      *version = 3.28    12 May 2011
      *version = 3.27     3 Mar 2011
      *version = 3.26    30 Dec 2010
      *version = 3.25    9 June 2010
      *version = 3.24    26 Jan 2010
      *version = 3.23     7 Jan 2010
      *version = 3.22    28 Oct 2009
      *version = 3.21    24 Sep 2009
      *version = 3.20    31 Aug 2009
      *version = 3.18    12 May 2009 (beta version)
      *version = 3.14    18 Mar 2009 
      *version = 3.13     5 Jan 2009 
      *version = 3.12     8 Oct 2008 
      *version = 3.11    19 Sep 2008 
      *version = 3.10    20 Aug 2008 
      *version = 3.09     3 Jun 2008 
      *version = 3.08    15 Apr 2007  (internal release)
      *version = 3.07     5 Nov 2007  (internal release)
      *version = 3.06    27 Aug 2007  
      *version = 3.05    12 Jul 2007  (internal release)
      *version = 3.03    11 Dec 2006
      *version = 3.02    18 Sep 2006
      *version = 3.01       May 2006 included in FTOOLS 6.1 release
      *version = 3.006   20 Feb 2006 
      *version = 3.005   20 Dec 2005 (beta, in heasoft swift release
      *version = 3.004   16 Sep 2005 (beta, in heasoft swift release
      *version = 3.003   28 Jul 2005 (beta, in heasoft swift release
      *version = 3.002   15 Apr 2005 (beta)
      *version = 3.001   15 Mar 2005 (beta) released with heasoft 6.0
      *version = 3.000   1 Mar 2005 (internal release only)
      *version = 2.51     2 Dec 2004
      *version = 2.50    28 Jul 2004
      *version = 2.49    11 Feb 2004
      *version = 2.48    28 Jan 2004
      *version = 2.470   18 Aug 2003
      *version = 2.460   20 May 2003
      *version = 2.450   30 Apr 2003  (internal release only)
      *version = 2.440    8 Jan 2003
      *version = 2.430;   4 Nov 2002
      *version = 2.420;  19 Jul 2002
      *version = 2.410;  22 Apr 2002 used in ftools v5.2
      *version = 2.401;  28 Jan 2002
      *version = 2.400;  18 Jan 2002
      *version = 2.301;   7 Dec 2001
      *version = 2.300;  23 Oct 2001
      *version = 2.204;  26 Jul 2001
      *version = 2.203;  19 Jul 2001 used in ftools v5.1
      *version = 2.202;  22 May 2001
      *version = 2.201;  15 Mar 2001
      *version = 2.200;  26 Jan 2001
      *version = 2.100;  26 Sep 2000
      *version = 2.037;   6 Jul 2000
      *version = 2.036;   1 Feb 2000
      *version = 2.035;   7 Dec 1999 (internal release only)
      *version = 2.034;  23 Nov 1999
      *version = 2.033;  17 Sep 1999
      *version = 2.032;  25 May 1999
      *version = 2.031;  31 Mar 1999
      *version = 2.030;  24 Feb 1999
      *version = 2.029;  11 Feb 1999
      *version = 2.028;  26 Jan 1999
      *version = 2.027;  12 Jan 1999
      *version = 2.026;  23 Dec 1998
      *version = 2.025;   1 Dec 1998
      *version = 2.024;   9 Nov 1998
      *version = 2.023;   1 Nov 1998 first full release of V2.0
      *version = 1.42;   30 Apr 1998
      *version = 1.40;    6 Feb 1998
      *version = 1.33;   16 Dec 1997 (internal release only)
      *version = 1.32;   21 Nov 1997 (internal release only)
      *version = 1.31;    4 Nov 1997 (internal release only)
      *version = 1.30;   11 Sep 1997
      *version = 1.27;    3 Sep 1997 (internal release only)
      *version = 1.25;    2 Jul 1997
      *version = 1.24;    2 May 1997
      *version = 1.23;   24 Apr 1997
      *version = 1.22;   18 Apr 1997
      *version = 1.21;   26 Mar 1997
      *version = 1.2;    29 Jan 1997
      *version = 1.11;   04 Dec 1996
      *version = 1.101;  13 Nov 1996
      *version = 1.1;     6 Nov 1996
      *version = 1.04;   17 Sep 1996
      *version = 1.03;   20 Aug 1996
      *version = 1.02;   15 Aug 1996
      *version = 1.01;   12 Aug 1996
*/

    return(*version);
}